

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O2

XYZ __thiscall pbrt::SampledSpectrum::ToXYZ(SampledSpectrum *this,SampledWavelengths *lambda)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Float FVar3;
  Float FVar4;
  undefined1 in_ZMM0 [64];
  undefined1 auVar16 [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar27 [56];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  XYZ XVar28;
  SampledSpectrum SVar29;
  SampledSpectrum pdf;
  SampledSpectrum Z;
  SampledSpectrum Y;
  SampledSpectrum X;
  SampledSpectrum local_c8;
  SampledSpectrum local_b8;
  SampledSpectrum local_a8;
  SampledSpectrum local_98;
  SampledSpectrum local_88;
  SampledSpectrum local_78;
  SampledSpectrum local_68;
  SampledSpectrum local_58;
  SampledSpectrum local_48;
  SampledSpectrum local_38;
  undefined1 extraout_var [60];
  
  auVar27 = in_ZMM1._8_56_;
  auVar16 = in_ZMM0._8_56_;
  SVar29 = DenselySampledSpectrum::Sample(Spectra::x,lambda);
  auVar17._0_8_ = SVar29.values.values._8_8_;
  auVar17._8_56_ = auVar27;
  auVar5._0_8_ = SVar29.values.values._0_8_;
  auVar5._8_56_ = auVar16;
  local_38.values.values = (array<float,_4>)vmovlhps_avx(auVar5._0_16_,auVar17._0_16_);
  auVar16 = ZEXT856(local_38.values.values._8_8_);
  SVar29 = DenselySampledSpectrum::Sample(Spectra::y,lambda);
  auVar18._0_8_ = SVar29.values.values._8_8_;
  auVar18._8_56_ = auVar27;
  auVar6._0_8_ = SVar29.values.values._0_8_;
  auVar6._8_56_ = auVar16;
  local_48.values.values = (array<float,_4>)vmovlhps_avx(auVar6._0_16_,auVar18._0_16_);
  auVar16 = ZEXT856(local_48.values.values._8_8_);
  SVar29 = DenselySampledSpectrum::Sample(Spectra::z,lambda);
  auVar19._0_8_ = SVar29.values.values._8_8_;
  auVar19._8_56_ = auVar27;
  auVar7._0_8_ = SVar29.values.values._0_8_;
  auVar7._8_56_ = auVar16;
  local_58.values.values = (array<float,_4>)vmovlhps_avx(auVar7._0_16_,auVar19._0_16_);
  auVar16 = ZEXT856(local_58.values.values._8_8_);
  SVar29 = SampledWavelengths::PDF(lambda);
  auVar20._0_8_ = SVar29.values.values._8_8_;
  auVar20._8_56_ = auVar27;
  auVar8._0_8_ = SVar29.values.values._0_8_;
  auVar8._8_56_ = auVar16;
  local_68.values.values = (array<float,_4>)vmovlhps_avx(auVar8._0_16_,auVar20._0_16_);
  auVar16 = ZEXT856(local_68.values.values._8_8_);
  SVar29 = operator*(&local_38,this);
  auVar21._0_8_ = SVar29.values.values._8_8_;
  auVar21._8_56_ = auVar27;
  auVar9._0_8_ = SVar29.values.values._0_8_;
  auVar9._8_56_ = auVar16;
  local_88.values.values = (array<float,_4>)vmovlhps_avx(auVar9._0_16_,auVar21._0_16_);
  auVar16 = ZEXT856(local_88.values.values._8_8_);
  SVar29 = SafeDiv(&local_88,&local_68);
  auVar22._0_8_ = SVar29.values.values._8_8_;
  auVar22._8_56_ = auVar27;
  auVar10._0_8_ = SVar29.values.values._0_8_;
  auVar10._8_56_ = auVar16;
  local_78.values.values = (array<float,_4>)vmovlhps_avx(auVar10._0_16_,auVar22._0_16_);
  auVar11._0_4_ = Average(&local_78);
  auVar11._4_60_ = extraout_var;
  auVar16 = extraout_var._4_56_;
  SVar29 = operator*(&local_48,this);
  auVar23._0_8_ = SVar29.values.values._8_8_;
  auVar23._8_56_ = auVar27;
  auVar12._0_8_ = SVar29.values.values._0_8_;
  auVar12._8_56_ = auVar16;
  local_a8.values.values = (array<float,_4>)vmovlhps_avx(auVar12._0_16_,auVar23._0_16_);
  auVar16 = ZEXT856(local_a8.values.values._8_8_);
  SVar29 = SafeDiv(&local_a8,&local_68);
  auVar24._0_8_ = SVar29.values.values._8_8_;
  auVar24._8_56_ = auVar27;
  auVar13._0_8_ = SVar29.values.values._0_8_;
  auVar13._8_56_ = auVar16;
  local_98.values.values = (array<float,_4>)vmovlhps_avx(auVar13._0_16_,auVar24._0_16_);
  FVar3 = Average(&local_98);
  auVar16 = extraout_var_00;
  SVar29 = operator*(&local_58,this);
  auVar25._0_8_ = SVar29.values.values._8_8_;
  auVar25._8_56_ = auVar27;
  auVar14._0_8_ = SVar29.values.values._0_8_;
  auVar14._8_56_ = auVar16;
  local_c8.values.values = (array<float,_4>)vmovlhps_avx(auVar14._0_16_,auVar25._0_16_);
  auVar16 = ZEXT856(local_c8.values.values._8_8_);
  SVar29 = SafeDiv(&local_c8,&local_68);
  auVar26._0_8_ = SVar29.values.values._8_8_;
  auVar26._8_56_ = auVar27;
  auVar15._0_8_ = SVar29.values.values._0_8_;
  auVar15._8_56_ = auVar16;
  local_b8.values.values = (array<float,_4>)vmovlhps_avx(auVar15._0_16_,auVar26._0_16_);
  FVar4 = Average(&local_b8);
  auVar2 = vinsertps_avx(auVar11._0_16_,ZEXT416((uint)FVar3),0x10);
  auVar1._8_4_ = 0x42d5b6bb;
  auVar1._0_8_ = 0x42d5b6bb42d5b6bb;
  auVar1._12_4_ = 0x42d5b6bb;
  auVar2 = vdivps_avx512vl(auVar2,auVar1);
  XVar28.Z = FVar4 / 106.856895;
  XVar28._0_8_ = auVar2._0_8_;
  return XVar28;
}

Assistant:

XYZ SampledSpectrum::ToXYZ(const SampledWavelengths &lambda) const {
    SampledSpectrum X = Spectra::X().Sample(lambda);
    SampledSpectrum Y = Spectra::Y().Sample(lambda);
    SampledSpectrum Z = Spectra::Z().Sample(lambda);
    SampledSpectrum pdf = lambda.PDF();

    return XYZ(SafeDiv(X * *this, pdf).Average(), SafeDiv(Y * *this, pdf).Average(),
               SafeDiv(Z * *this, pdf).Average()) /
           CIE_Y_integral;
}